

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.h
# Opt level: O2

void __thiscall
shift_window_transformer::SoftMax<float>::forward
          (SoftMax<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  pointer pfVar1;
  ulong uVar2;
  ulong uVar3;
  int j;
  long lVar4;
  long lVar5;
  bool bVar6;
  float fVar7;
  double dVar8;
  float local_54;
  ulong local_50;
  double local_48;
  long local_40;
  ulong local_38;
  
  local_50 = (ulong)(input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
  pfVar1 = (output->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((output->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish !=
      pfVar1) {
    (output->super_vector<float,_std::allocator<float>_>).
    super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         pfVar1;
  }
  std::vector<int,_std::allocator<int>_>::operator=(&output->shape,&input->shape);
  lVar5 = 0;
  uVar3 = 0;
  if (0 < (int)local_50) {
    uVar3 = local_50 & 0xffffffff;
  }
  local_40 = local_50 * 4;
  for (local_38 = 0;
      local_38 <
      (ulong)((long)(input->super_vector<float,_std::allocator<float>_>).
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(input->super_vector<float,_std::allocator<float>_>).
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); local_38 = local_38 + local_50) {
    fVar7 = 0.0;
    uVar2 = uVar3;
    lVar4 = lVar5;
    while( true ) {
      local_48 = (double)fVar7;
      bVar6 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if (bVar6) break;
      dVar8 = exp((double)*(float *)((long)(input->super_vector<float,_std::allocator<float>_>).
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start + lVar4));
      fVar7 = (float)(dVar8 + local_48);
      lVar4 = lVar4 + 4;
    }
    for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      dVar8 = exp((double)*(float *)((long)(input->super_vector<float,_std::allocator<float>_>).
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start + uVar2 * 4 + lVar5));
      local_54 = (float)(dVar8 / local_48);
      std::vector<float,_std::allocator<float>_>::emplace_back<float>
                (&output->super_vector<float,_std::allocator<float>_>,&local_54);
    }
    lVar5 = lVar5 + local_40;
  }
  return;
}

Assistant:

void forward(const Tensor <T> &input, Tensor <T> &output) {
            int dim = input.shape.back();
            output.clear();
            output.shape = input.shape;
            for (int i = 0; i < input.size(); i += dim) {
                T sum = 0;
                for (int j = 0; j < dim; ++j) {
                    sum += exp(input[i + j]);
                }
                for (int j = 0; j < dim; ++j) {
                    output.push_back(exp(input[i + j]) / sum);
                }
            }
        }